

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::kwsysUnPutEnv(string *env)

{
  char *pcVar1;
  string local_38 [8];
  string name;
  size_t pos;
  string *env_local;
  
  name.field_2._8_8_ = std::__cxx11::string::find((char)env,0x3d);
  if (name.field_2._8_8_ == -1) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    unsetenv(pcVar1);
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)env);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    unsetenv(pcVar1);
    std::__cxx11::string::~string(local_38);
  }
  return 0;
}

Assistant:

static int kwsysUnPutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if(pos != env.npos)
    {
    std::string name = env.substr(0, pos);
    unsetenv(name.c_str());
    }
  else
    {
    unsetenv(env.c_str());
    }
  return 0;
}